

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

string * __thiscall
Polynomial::evaluateSymbolic
          (string *__return_storage_ptr__,Polynomial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *varnames)

{
  pointer poVar1;
  int i;
  int iVar2;
  string *psVar3;
  long lVar4;
  ulong uVar5;
  int i_1;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar2 = 0; iVar2 < this->mNumStates; iVar2 = iVar2 + 1) {
    std::__cxx11::to_string(&local_d8,iVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  lVar4 = 0;
  local_58 = __return_storage_ptr__;
  for (lVar6 = 0; lVar6 < this->mNumVariables; lVar6 = lVar6 + 1) {
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_f8,
                (value_type *)
                ((long)&(((varnames->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    lVar4 = lVar4 + 0x20;
  }
  uVar5 = (ulong)this->mFirstOperation;
  uVar7 = uVar5 << 5 | 8;
  do {
    psVar3 = local_58;
    if (this->mResultLocation < (int)uVar5) {
      std::__cxx11::string::string
                ((string *)local_58,
                 (string *)
                 (local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->mResultLocation));
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      return psVar3;
    }
    iVar2 = this->mFirstOperation;
    poVar1 = (this->mOperands).
             super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
             super__Vector_impl_data._M_start;
    switch(*(undefined4 *)((long)poVar1 + (uVar7 - 8) + (long)iVar2 * -0x20)) {
    case 0:
      std::operator+(&local_b8,"(",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+(&local_78,&local_b8,"+");
      std::operator+(&local_98,&local_78,
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)((long)&poVar1[-(long)iVar2].op + uVar7) + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      break;
    case 1:
      std::operator+(&local_b8,"(",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+(&local_78,&local_b8,"*");
      std::operator+(&local_98,&local_78,
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)((long)&poVar1[-(long)iVar2].op + uVar7) + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      break;
    case 2:
      std::operator+(&local_b8,"(",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+(&local_78,&local_b8,"^");
      std::__cxx11::to_string
                (&local_50,*(int *)(*(long *)((long)&poVar1[-(long)iVar2].op + uVar7) + 4));
      std::operator+(&local_98,&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      psVar3 = &local_50;
      goto LAB_001530af;
    case 3:
      std::operator+(&local_98,"(~",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      goto switchD_00152d92_default;
    case 4:
      std::operator+(&local_b8,"max(",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+(&local_78,&local_b8,",");
      std::operator+(&local_98,&local_78,
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)((long)&poVar1[-(long)iVar2].op + uVar7) + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      break;
    case 5:
      std::operator+(&local_b8,"min(",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     **(int **)((long)&poVar1[-(long)iVar2].op + uVar7));
      std::operator+(&local_78,&local_b8,",");
      std::operator+(&local_98,&local_78,
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)((long)&poVar1[-(long)iVar2].op + uVar7) + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_98,")");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      break;
    default:
      goto switchD_00152d92_default;
    }
    psVar3 = (string *)&local_98;
    std::__cxx11::string::~string((string *)&local_d8);
LAB_001530af:
    std::__cxx11::string::~string((string *)psVar3);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
switchD_00152d92_default:
    uVar5 = (ulong)((int)uVar5 + 1);
    uVar7 = uVar7 + 0x20;
  } while( true );
}

Assistant:

std::string Polynomial::evaluateSymbolic(const std::vector<std::string>& varnames) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  std::vector<std::string> strs; // one for each element in mEvaluationValues, up to the result
  for (int i=0; i < mNumStates; ++i)
    strs.push_back(std::to_string(i));
  for (int i=0; i<mNumVariables; i++)
    strs.push_back(varnames[i]); // previously: "x" + std::to_string(i));
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        strs.push_back("(" + strs[a.args[0]] + "+" + strs[a.args[1]] + ")");
        break;
      case operandType::TIMES:
        strs.push_back("(" + strs[a.args[0]] + "*" + strs[a.args[1]] + ")");
        break;
      case operandType::POWER:
        strs.push_back("(" + strs[a.args[0]] + "^" + std::to_string(a.args[1]) + ")");
        break;
      case operandType::MAX:
        strs.push_back("max(" + strs[a.args[0]] + "," + strs[a.args[1]] + ")");
        break;
      case operandType::MIN:
        strs.push_back("min(" + strs[a.args[0]] + "," + strs[a.args[1]] + ")");
        break;
      case operandType::NOT:
        strs.push_back("(~" + strs[a.args[0]] + ")");
        break;
      }
    }
  return strs[mResultLocation];
}